

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trace.h
# Opt level: O0

void NULLC::TraceDump(void)

{
  OutputContext *pOVar1;
  uint *puVar2;
  undefined8 *puVar3;
  TraceScopeToken *token;
  TraceEvent *traceEvent;
  uint i;
  uint currentLabel;
  TraceContext *context;
  
  pOVar1 = traceContext;
  if ((traceContext[1].outputBufDef[0] & 1U) == 0) {
    pOVar1[1].outputBufDef[0x30] = '\0';
    pOVar1[1].outputBufDef[0x31] = '\0';
    pOVar1[1].outputBufDef[0x32] = '\0';
    pOVar1[1].outputBufDef[0x33] = '\0';
    pOVar1[1].outputBufDef[0x20] = '\0';
    pOVar1[1].outputBufDef[0x21] = '\0';
    pOVar1[1].outputBufDef[0x22] = '\0';
    pOVar1[1].outputBufDef[0x23] = '\0';
  }
  else {
    traceEvent._4_4_ = 0;
    for (traceEvent._0_4_ = 0; (uint)traceEvent < *(uint *)(pOVar1[1].outputBufDef + 0x30);
        traceEvent._0_4_ = (uint)traceEvent + 1) {
      puVar2 = (uint *)(*(long *)(pOVar1[1].outputBufDef + 0x38) + (ulong)(uint)traceEvent * 8);
      if ((*puVar2 & 1) == 0) {
        if ((*puVar2 >> 1 & 1) == 0) {
          if ((pOVar1[1].outputBufDef[2] & 1U) == 0) {
            if ((pOVar1[1].outputBufDef[1] & 1U) != 0) {
              OutputContext::Printf(pOVar1,",\n");
              pOVar1[1].outputBufDef[1] = '\0';
            }
          }
          else {
            if (traceEvent._4_4_ != 0) {
              OutputContext::Printf(pOVar1,"}");
              traceEvent._4_4_ = 0;
            }
            OutputContext::Printf(pOVar1,"},\n");
          }
          pOVar1[1].outputBufDef[2] = '\0';
          if (*(uint *)(pOVar1[1].outputBufDef + 8) < 0x21) {
            OutputContext::Printf
                      (pOVar1,"{\"ph\":\"E\",\"ts\":%d,\"pid\":1,\"tid\":1}",(ulong)puVar2[1]);
            pOVar1[1].outputBufDef[1] = '\x01';
            *(int *)(pOVar1[1].outputBufDef + 8) = *(int *)(pOVar1[1].outputBufDef + 8) + -1;
          }
          else {
            *(int *)(pOVar1[1].outputBufDef + 8) = *(int *)(pOVar1[1].outputBufDef + 8) + -1;
          }
        }
        else if (*(uint *)(pOVar1[1].outputBufDef + 8) < 0x21) {
          if (traceEvent._4_4_ == 0) {
            OutputContext::Printf(pOVar1,",\"args\":{");
          }
          else {
            OutputContext::Printf(pOVar1,",");
          }
          OutputContext::Printf
                    (pOVar1,"\"label %d\":\"%s\"",(ulong)traceEvent._4_4_,
                     *(long *)(pOVar1[1].outputBufDef + 0x28) + (ulong)(*puVar2 >> 2));
          traceEvent._4_4_ = traceEvent._4_4_ + 1;
        }
      }
      else {
        puVar3 = (undefined8 *)
                 (*(long *)(pOVar1[1].outputBufDef + 0x18) + (ulong)(*puVar2 >> 2) * 0x10);
        if ((pOVar1[1].outputBufDef[2] & 1U) == 0) {
          if ((pOVar1[1].outputBufDef[1] & 1U) != 0) {
            OutputContext::Printf(pOVar1,",\n");
            pOVar1[1].outputBufDef[1] = '\0';
          }
        }
        else {
          if (traceEvent._4_4_ != 0) {
            OutputContext::Printf(pOVar1,"}");
            traceEvent._4_4_ = 0;
          }
          OutputContext::Printf(pOVar1,"},\n");
        }
        pOVar1[1].outputBufDef[2] = '\0';
        *(int *)(pOVar1[1].outputBufDef + 8) = *(int *)(pOVar1[1].outputBufDef + 8) + 1;
        if (*(uint *)(pOVar1[1].outputBufDef + 8) < 0x21) {
          OutputContext::Printf
                    (pOVar1,
                     "{\"ph\":\"B\",\"ts\":%d,\"pid\":1,\"tid\":1,\"name\":\"%s\",\"cat\":\"%s\"",
                     (ulong)puVar2[1],puVar3[1],*puVar3);
          pOVar1[1].outputBufDef[2] = '\x01';
        }
      }
    }
    if ((pOVar1[1].outputBufDef[2] & 1U) != 0) {
      if (traceEvent._4_4_ != 0) {
        OutputContext::Printf(pOVar1,"}");
      }
      OutputContext::Printf(pOVar1,"}");
      pOVar1[1].outputBufDef[1] = '\x01';
    }
    pOVar1[1].outputBufDef[2] = '\0';
    pOVar1[1].outputBufDef[0x30] = '\0';
    pOVar1[1].outputBufDef[0x31] = '\0';
    pOVar1[1].outputBufDef[0x32] = '\0';
    pOVar1[1].outputBufDef[0x33] = '\0';
    pOVar1[1].outputBufDef[0x20] = '\0';
    pOVar1[1].outputBufDef[0x21] = '\0';
    pOVar1[1].outputBufDef[0x22] = '\0';
    pOVar1[1].outputBufDef[0x23] = '\0';
  }
  return;
}

Assistant:

inline void TraceDump()
	{
		TraceContext &context = *traceContext;

		if(!context.outputEnabled)
		{
			context.events.count = 0;
			context.labels.count = 0;
			return;
		}

		unsigned currentLabel = 0;

		for(unsigned i = 0; i < context.events.count; i++)
		{
			TraceEvent &traceEvent = context.events.data[i];

			if(traceEvent.isEnter)
			{
				TraceScopeToken &token = context.scopeTokens.data[traceEvent.token];

				if(context.openEvent)
				{
					if(currentLabel != 0)
					{
						context.output.Printf("}");
						currentLabel = 0;
					}

					context.output.Printf("},\n");
				}
				else if(context.needComma)
				{
					context.output.Printf(",\n");
					context.needComma = false;
				}

				context.openEvent = false;

				context.outputDepth++;

				if(context.outputDepth > 32)
					continue;

				context.output.Printf("{\"ph\":\"B\",\"ts\":%d,\"pid\":1,\"tid\":1,\"name\":\"%s\",\"cat\":\"%s\"", traceEvent.ts, token.name, token.category);

				context.openEvent = true;
			}
			else if(traceEvent.isLabel)
			{
				if(context.outputDepth > 32)
					continue;

				if(currentLabel == 0)
					context.output.Printf(",\"args\":{");
				else
					context.output.Printf(",");

				context.output.Printf("\"label %d\":\"%s\"", currentLabel, &context.labels.data[traceEvent.token]);
				currentLabel++;
			}
			else
			{
				if(context.openEvent)
				{
					if(currentLabel != 0)
					{
						context.output.Printf("}");
						currentLabel = 0;
					}

					context.output.Printf("},\n");
				}
				else if(context.needComma)
				{
					context.output.Printf(",\n");
					context.needComma = false;
				}

				context.openEvent = false;

				if(context.outputDepth > 32)
				{
					context.outputDepth--;
					continue;
				}

				context.output.Printf("{\"ph\":\"E\",\"ts\":%d,\"pid\":1,\"tid\":1}", traceEvent.ts);

				context.needComma = true;

				context.outputDepth--;
			}
		}

		if(context.openEvent)
		{
			if(currentLabel != 0)
			{
				context.output.Printf("}");
				currentLabel = 0;
			}

			context.output.Printf("}");

			context.needComma = true;
		}

		context.openEvent = false;

		context.events.count = 0;
		context.labels.count = 0;
	}